

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateNotCalledWithExecutionModel
          (BuiltInsValidator *this,int vuid,char *comment,ExecutionModel execution_model,
          Decoration *decoration,Instruction *built_in_inst,Instruction *referenced_inst,
          Instruction *referenced_from_inst)

{
  _Rb_tree_header *p_Var1;
  spv_result_t sVar2;
  _Base_ptr p_Var3;
  list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
  *__position;
  DiagnosticStream *pDVar4;
  _Base_ptr p_Var5;
  Instruction *inst;
  Instruction *inst_00;
  Instruction *inst_01;
  bool bVar6;
  char *built_in_str;
  char *execution_model_str;
  spv_operand_desc desc;
  _Any_data local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  char *local_280;
  char *local_278;
  char *local_270;
  string local_268;
  string local_248;
  string local_228;
  undefined1 local_208 [16];
  _Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
  local_1f8;
  _Head_base<3UL,_spv::ExecutionModel,_false> local_c0;
  _Head_base<2UL,_const_char_*,_false> local_b8;
  _Head_base<1UL,_int,_false> local_b0;
  _Head_base<0UL,_spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_false> local_a8;
  
  local_270 = comment;
  if (this->function_id_ == 0) {
    local_268._M_dataplus._M_p._0_4_ = (referenced_from_inst->inst_).result_id;
    __position = (list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
                  *)std::
                    map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                    ::operator[](&this->id_to_at_reference_checks_,(key_type_conflict *)&local_268);
    local_208._0_8_ = ValidateNotCalledWithExecutionModel;
    local_208._8_8_ = 0;
    std::
    _Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::_Tuple_impl(&local_1f8,decoration,built_in_inst,referenced_from_inst,
                  (_Placeholder<1> *)&std::placeholders::_1);
    local_c0._M_head_impl = execution_model;
    local_b8._M_head_impl = comment;
    local_b0._M_head_impl = vuid;
    local_a8._M_head_impl = this;
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)local_2a0._M_pod_data,
               (_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
                *)local_208);
    std::__cxx11::
    list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
    ::_M_insert<std::function<spv_result_t(spvtools::val::Instruction_const&)>>
              (__position,(iterator)__position,
               (function<spv_result_t_(const_spvtools::val::Instruction_&)> *)&local_2a0);
    if ((code *)local_290._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_290._M_allocated_capacity)(&local_2a0,&local_2a0,3);
    }
    if (local_1f8.super__Head_base<4UL,_spvtools::val::Decoration,_false>._M_head_impl.params_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.super__Head_base<4UL,_spvtools::val::Decoration,_false>._M_head_impl
                      .params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.super__Head_base<4UL,_spvtools::val::Decoration,_false>.
                            _M_head_impl.params_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.super__Head_base<4UL,_spvtools::val::Decoration,_false>.
                            _M_head_impl.params_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<5UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<5UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
                      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<5UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<5UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<5UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<5UL,_spvtools::val::Instruction,_false>._M_head_impl.
                      operands_.
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<5UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<5UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<5UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<5UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<5UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<5UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<6UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<6UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<6UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<6UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
                      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<6UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<6UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<6UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<6UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<6UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<6UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<6UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<6UL,_spvtools::val::Instruction,_false>._M_head_impl.
                      operands_.
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<6UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<6UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<6UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<6UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<6UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<6UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<6UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<6UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<6UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<6UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<5UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<6UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<6UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    sVar2 = SPV_SUCCESS;
  }
  else {
    p_Var3 = (this->execution_models_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    sVar2 = SPV_SUCCESS;
    if (p_Var3 != (_Base_ptr)0x0) {
      p_Var1 = &(this->execution_models_)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = &p_Var1->_M_header;
      do {
        bVar6 = p_Var3[1]._M_color < execution_model;
        if (!bVar6) {
          p_Var5 = p_Var3;
        }
        p_Var3 = (&p_Var3->_M_left)[bVar6];
      } while (p_Var3 != (_Base_ptr)0x0);
      sVar2 = SPV_SUCCESS;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var5[1]._M_color <= execution_model)) {
        local_208._0_8_ = (spv_operand_desc)0x0;
        sVar2 = AssemblyGrammar::lookupOperand
                          (&this->_->grammar_,SPV_OPERAND_TYPE_EXECUTION_MODEL,execution_model,
                           (spv_operand_desc *)local_208);
        if ((spv_operand_desc)local_208._0_8_ == (spv_operand_desc)0x0 || sVar2 != SPV_SUCCESS) {
          local_278 = "Unknown";
        }
        else {
          local_278 = *(char **)local_208._0_8_;
        }
        if (decoration->dec_type_ != BuiltIn) {
          __assert_fail("dec_type_ == spv::Decoration::BuiltIn",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/decoration.h"
                        ,0x4f,"spv::BuiltIn spvtools::val::Decoration::builtin() const");
        }
        local_208._0_8_ = (spv_operand_desc)0x0;
        sVar2 = AssemblyGrammar::lookupOperand
                          (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,
                           *(decoration->params_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,(spv_operand_desc *)local_208);
        if ((spv_operand_desc)local_208._0_8_ == (spv_operand_desc)0x0 || sVar2 != SPV_SUCCESS) {
          local_280 = "Unknown";
        }
        else {
          local_280 = *(char **)local_208._0_8_;
        }
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst
                  );
        if (vuid < 0) {
          local_2a0._M_unused._M_object = &local_290;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"");
        }
        else {
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2a0,this->_,vuid,(char *)0x0);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_2a0._M_unused._0_8_,local_2a0._8_8_);
        pDVar4 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_270);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar4," ",1);
        (anonymous_namespace)::GetIdDesc_abi_cxx11_
                  (&local_268,(_anonymous_namespace_ *)referenced_inst,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar4,
                   (char *)CONCAT44(local_268._M_dataplus._M_p._4_4_,
                                    (uint32_t)local_268._M_dataplus._M_p),local_268._M_string_length
                  );
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar4," depends on ",0xc);
        (anonymous_namespace)::GetIdDesc_abi_cxx11_
                  (&local_228,(_anonymous_namespace_ *)built_in_inst,inst_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar4,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar4," which is decorated with BuiltIn ",0x21);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_280);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar4,".",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar4," Id <",5);
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar4,"> is later referenced by ",0x19);
        (anonymous_namespace)::GetIdDesc_abi_cxx11_
                  (&local_248,(_anonymous_namespace_ *)referenced_from_inst,inst_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar4,local_248._M_dataplus._M_p,local_248._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar4," in function <",0xe);
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar4,"> which is called with execution model ",0x27);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_278);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar4,".",1);
        sVar2 = pDVar4->error_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_268._M_dataplus._M_p._4_4_,(uint32_t)local_268._M_dataplus._M_p) !=
            &local_268.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_268._M_dataplus._M_p._4_4_,
                                   (uint32_t)local_268._M_dataplus._M_p),
                          local_268.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_unused._0_8_ != &local_290) {
          operator_delete(local_2a0._M_unused._M_object,(ulong)(local_290._M_allocated_capacity + 1)
                         );
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      }
    }
  }
  return sVar2;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateNotCalledWithExecutionModel(
    int vuid, const char* comment, spv::ExecutionModel execution_model,
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (function_id_) {
    if (execution_models_.count(execution_model)) {
      const char* execution_model_str = _.grammar().lookupOperandName(
          SPV_OPERAND_TYPE_EXECUTION_MODEL, uint32_t(execution_model));
      const char* built_in_str = _.grammar().lookupOperandName(
          SPV_OPERAND_TYPE_BUILT_IN, (uint32_t)decoration.builtin());
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << (vuid < 0 ? std::string("") : _.VkErrorID(vuid)) << comment
             << " " << GetIdDesc(referenced_inst) << " depends on "
             << GetIdDesc(built_in_inst) << " which is decorated with BuiltIn "
             << built_in_str << "."
             << " Id <" << referenced_inst.id() << "> is later referenced by "
             << GetIdDesc(referenced_from_inst) << " in function <"
             << function_id_ << "> which is called with execution model "
             << execution_model_str << ".";
    }
  } else {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(
        std::bind(&BuiltInsValidator::ValidateNotCalledWithExecutionModel, this,
                  vuid, comment, execution_model, decoration, built_in_inst,
                  referenced_from_inst, std::placeholders::_1));
  }
  return SPV_SUCCESS;
}